

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_saveg.cpp
# Opt level: O0

void P_SerializeSubsectors(FArchive *arc)

{
  bool bVar1;
  FArchive *pFVar2;
  int local_38;
  int local_34;
  int j_1;
  int i_2;
  int i_1;
  int v;
  int j;
  int i;
  int iStack_18;
  BYTE by;
  int num_nodes;
  int num_subs;
  int num_verts;
  FArchive *arc_local;
  
  _num_subs = arc;
  bVar1 = FArchive::IsStoring(arc);
  if (bVar1) {
    if ((hasglnodes & 1U) == 0) {
      i_2 = 0;
      pFVar2 = FArchive::operator<<(_num_subs,&i_2);
      pFVar2 = FArchive::operator<<(pFVar2,&i_2);
      FArchive::operator<<(pFVar2,&i_2);
    }
    else {
      pFVar2 = FArchive::operator<<(_num_subs,&numvertexes);
      pFVar2 = FArchive::operator<<(pFVar2,&numsubsectors);
      FArchive::operator<<(pFVar2,&numnodes);
      for (v = 0; v < numsubsectors; v = v + 8) {
        j._3_1_ = 0;
        for (i_1 = 0; i_1 < 8; i_1 = i_1 + 1) {
          if ((v + i_1 < numsubsectors) && ((subsectors[v + i_1].flags & 2U) != 0)) {
            j._3_1_ = j._3_1_ | (byte)(1 << ((byte)i_1 & 0x1f));
          }
        }
        FArchive::operator<<(_num_subs,(BYTE *)((long)&j + 3));
      }
    }
  }
  else {
    pFVar2 = FArchive::operator<<(_num_subs,&num_nodes);
    pFVar2 = FArchive::operator<<(pFVar2,&stack0xffffffffffffffe8);
    FArchive::operator<<(pFVar2,&i);
    if (((num_nodes == numvertexes) && (iStack_18 == numsubsectors)) && (i == numnodes)) {
      for (local_34 = 0; local_34 < numsubsectors; local_34 = local_34 + 8) {
        FArchive::operator<<(_num_subs,(BYTE *)((long)&j + 3));
        for (local_38 = 0; local_38 < 8; local_38 = local_38 + 1) {
          if ((((uint)j._3_1_ & 1 << ((byte)local_38 & 0x1f)) != 0) &&
             (local_34 + local_38 < numsubsectors)) {
            subsectors[local_34 + local_38].flags = subsectors[local_34 + local_38].flags | 2;
          }
        }
      }
    }
    else {
      for (j_1 = 0; j_1 < iStack_18; j_1 = j_1 + 8) {
        FArchive::operator<<(_num_subs,(BYTE *)((long)&j + 3));
      }
      if ((hasglnodes & 1U) != 0) {
        RecalculateDrawnSubsectors();
      }
    }
  }
  return;
}

Assistant:

void P_SerializeSubsectors(FArchive &arc)
{
	int num_verts, num_subs, num_nodes;	
	BYTE by;

	if (arc.IsStoring())
	{
		if (hasglnodes)
		{
			arc << numvertexes << numsubsectors << numnodes;	// These are only for verification
			for(int i=0;i<numsubsectors;i+=8)
			{
				by = 0;
				for(int j=0;j<8;j++)
				{
					if (i+j<numsubsectors && (subsectors[i+j].flags & SSECF_DRAWN))
					{
						by |= (1<<j);
					}
				}
				arc << by;
			}
		}
		else
		{
			int v = 0;
			arc << v << v << v;
		}
	}
	else
	{
		arc << num_verts << num_subs << num_nodes;
		if (num_verts != numvertexes ||
			num_subs != numsubsectors ||
			num_nodes != numnodes)
		{
			// Nodes don't match - we can't use this info
			for(int i=0;i<num_subs;i+=8)
			{
				// Skip the subsector info.
				arc << by;
			}
			if (hasglnodes)
			{
				RecalculateDrawnSubsectors();
			}
			return;
		}
		else
		{
			for(int i=0;i<numsubsectors;i+=8)
			{
				arc << by;
				for(int j=0;j<8;j++)
				{
					if ((by & (1<<j)) && i+j<numsubsectors)
					{
						subsectors[i+j].flags |= SSECF_DRAWN;
					}
				}
			}
		}
	}
}